

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmVariableWatchCommand.cxx
# Opt level: O1

void cmVariableWatchCommandVariableAccessed
               (string *variable,int access_type,void *client_data,char *newValue,cmMakefile *mf)

{
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *this;
  long *plVar1;
  pointer pcVar2;
  cmMakefile *this_00;
  pointer pcVar3;
  pointer pcVar4;
  bool bVar5;
  char *pcVar6;
  size_t sVar7;
  ostream *poVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  pointer pcVar10;
  cmExecutionStatus status;
  string stack;
  ostringstream error;
  cmListFileFunction newLFF;
  cmListFileArgument arg;
  string local_298;
  cmExecutionStatus local_274;
  char *local_270;
  cmMakefile *local_268;
  char *local_260;
  long *local_258;
  long local_250;
  long local_248 [2];
  undefined1 local_238 [32];
  Delimiter local_218;
  long local_210;
  ios_base local_1c8 [264];
  cmListFileFunction local_c0;
  undefined1 *local_60;
  undefined8 local_58;
  undefined1 local_50;
  undefined7 uStack_4f;
  undefined4 local_40;
  undefined8 local_38;
  
  if (*client_data != '\0') {
    return;
  }
  *(undefined1 *)client_data = 1;
  local_c0.super_cmListFileContext.Name._M_dataplus._M_p =
       (pointer)&local_c0.super_cmListFileContext.Name.field_2;
  local_c0.super_cmListFileContext.Name._M_string_length = 0;
  local_c0.super_cmListFileContext.Name.field_2._M_local_buf[0] = '\0';
  local_c0.super_cmListFileContext.FilePath._M_dataplus._M_p =
       (pointer)&local_c0.super_cmListFileContext.FilePath.field_2;
  local_c0.super_cmListFileContext.FilePath._M_string_length = 0;
  local_c0.super_cmListFileContext.FilePath.field_2._M_local_buf[0] = '\0';
  local_c0.super_cmListFileContext.Line = 0;
  local_c0.Arguments.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c0.Arguments.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c0.Arguments.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_60 = &local_50;
  local_58 = 0;
  local_50 = 0;
  local_40 = 0;
  local_38 = 0;
  local_270 = cmVariableWatch::GetAccessAsString(access_type);
  pcVar2 = local_238 + 0x10;
  local_238._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"CMAKE_CURRENT_LIST_FILE","");
  local_260 = cmMakefile::GetDefinition(mf,(string *)local_238);
  if ((pointer)local_238._0_8_ != pcVar2) {
    operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
  }
  local_238._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"LISTFILE_STACK","");
  pcVar6 = cmMakefile::GetProperty(mf,(string *)local_238);
  std::__cxx11::string::string((string *)&local_258,pcVar6,(allocator *)&local_298);
  if ((pointer)local_238._0_8_ != pcVar2) {
    operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
  }
  pcVar4 = local_c0.Arguments.
           super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pcVar3 = local_c0.Arguments.
           super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (*(long *)((long)client_data + 0x10) == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_238);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,"Variable \"",10);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_238,(variable->_M_dataplus)._M_p,variable->_M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\" was accessed using ",0x15);
    pcVar6 = local_270;
    if (local_270 == (char *)0x0) {
      std::ios::clear((int)poVar8 + (int)poVar8->_vptr_basic_ostream[-3]);
    }
    else {
      sVar7 = strlen(local_270);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar6,sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," with value \"",0xd);
    pcVar6 = "";
    if (newValue != (char *)0x0) {
      pcVar6 = newValue;
    }
    sVar7 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar6,sVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\".",2);
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(mf,LOG,&local_298);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != &local_298.field_2) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_238);
    std::ios_base::~ios_base(local_1c8);
  }
  else {
    local_268 = mf;
    if (local_c0.Arguments.
        super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_c0.Arguments.
        super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
        super__Vector_impl_data._M_start) {
      paVar9 = &((local_c0.Arguments.
                  super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
                  _M_impl.super__Vector_impl_data._M_start)->Value).field_2;
      do {
        plVar1 = (long *)(((string *)(paVar9 + -1))->_M_dataplus)._M_p;
        if (paVar9 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)plVar1) {
          operator_delete(plVar1,paVar9->_M_allocated_capacity + 1);
        }
        pcVar10 = (pointer)(paVar9 + 2);
        paVar9 = paVar9 + 3;
      } while (pcVar10 != pcVar4);
      local_c0.Arguments.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
      ._M_impl.super__Vector_impl_data._M_finish = pcVar3;
    }
    local_238._0_8_ = local_238 + 0x10;
    pcVar2 = (variable->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_238,pcVar2,pcVar2 + variable->_M_string_length);
    this = &local_c0.Arguments;
    local_218 = Quoted;
    local_210 = 9999;
    std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::
    emplace_back<cmListFileArgument>(this,(cmListFileArgument *)local_238);
    pcVar6 = local_270;
    if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
      operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
    }
    std::__cxx11::string::string((string *)&local_298,pcVar6,(allocator *)&local_274);
    pcVar2 = local_238 + 0x10;
    local_238._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_238,local_298._M_dataplus._M_p,
               local_298._M_dataplus._M_p + local_298._M_string_length);
    local_218 = Quoted;
    local_210 = 9999;
    std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::
    emplace_back<cmListFileArgument>(this,(cmListFileArgument *)local_238);
    if ((pointer)local_238._0_8_ != pcVar2) {
      operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != &local_298.field_2) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    pcVar6 = "";
    if (newValue != (char *)0x0) {
      pcVar6 = newValue;
    }
    local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
    sVar7 = strlen(pcVar6);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,pcVar6,pcVar6 + sVar7);
    local_238._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_238,local_298._M_dataplus._M_p,
               local_298._M_dataplus._M_p + local_298._M_string_length);
    this_00 = local_268;
    local_218 = Quoted;
    local_210 = 9999;
    std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::
    emplace_back<cmListFileArgument>(this,(cmListFileArgument *)local_238);
    if ((pointer)local_238._0_8_ != pcVar2) {
      operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != &local_298.field_2) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::string((string *)&local_298,local_260,(allocator *)&local_274);
    local_238._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_238,local_298._M_dataplus._M_p,
               local_298._M_dataplus._M_p + local_298._M_string_length);
    local_218 = Quoted;
    local_210 = 9999;
    std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::
    emplace_back<cmListFileArgument>(this,(cmListFileArgument *)local_238);
    if ((pointer)local_238._0_8_ != pcVar2) {
      operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != &local_298.field_2) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    local_238._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_238,local_258,local_250 + (long)local_258);
    local_218 = Quoted;
    local_210 = 9999;
    std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::
    emplace_back<cmListFileArgument>(this,(cmListFileArgument *)local_238);
    if ((pointer)local_238._0_8_ != pcVar2) {
      operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
    }
    std::__cxx11::string::_M_assign((string *)&local_c0);
    std::__cxx11::string::_M_replace
              ((ulong)&local_c0.super_cmListFileContext.FilePath,0,
               (char *)local_c0.super_cmListFileContext.FilePath._M_string_length,0x537da4);
    local_c0.super_cmListFileContext.Line = 9999;
    local_274.ReturnInvoked = false;
    local_274.BreakInvoked = false;
    local_274.ContinueInvoked = false;
    local_274.NestedError = false;
    bVar5 = cmMakefile::ExecuteCommand(this_00,&local_c0,&local_274);
    if (!bVar5) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_238);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_238,"Error in cmake code at\nUnknown:0:\n",0x22);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_238,"A command failed during the invocation of callback \"",0x34);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_238,*(char **)((long)client_data + 8),
                          *(long *)((long)client_data + 0x10));
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\".",2);
      std::__cxx11::stringbuf::str();
      cmSystemTools::Error(local_298._M_dataplus._M_p,(char *)0x0,(char *)0x0,(char *)0x0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
      }
      *(undefined1 *)client_data = 0;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_238);
      std::ios_base::~ios_base(local_1c8);
      if (!bVar5) goto LAB_00397723;
    }
  }
  *(undefined1 *)client_data = 0;
LAB_00397723:
  if (local_258 != local_248) {
    operator_delete(local_258,local_248[0] + 1);
  }
  if (local_60 != &local_50) {
    operator_delete(local_60,CONCAT71(uStack_4f,local_50) + 1);
  }
  std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::~vector(&local_c0.Arguments)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.super_cmListFileContext.FilePath._M_dataplus._M_p !=
      &local_c0.super_cmListFileContext.FilePath.field_2) {
    operator_delete(local_c0.super_cmListFileContext.FilePath._M_dataplus._M_p,
                    CONCAT71(local_c0.super_cmListFileContext.FilePath.field_2._M_allocated_capacity
                             ._1_7_,local_c0.super_cmListFileContext.FilePath.field_2._M_local_buf
                                    [0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.super_cmListFileContext.Name._M_dataplus._M_p !=
      &local_c0.super_cmListFileContext.Name.field_2) {
    operator_delete(local_c0.super_cmListFileContext.Name._M_dataplus._M_p,
                    CONCAT71(local_c0.super_cmListFileContext.Name.field_2._M_allocated_capacity.
                             _1_7_,local_c0.super_cmListFileContext.Name.field_2._M_local_buf[0]) +
                    1);
  }
  return;
}

Assistant:

static void cmVariableWatchCommandVariableAccessed(
  const std::string& variable, int access_type, void* client_data,
  const char* newValue, const cmMakefile* mf)
{
  cmVariableWatchCallbackData* data
    = static_cast<cmVariableWatchCallbackData*>(client_data);

  if ( data->InCallback )
    {
    return;
    }
  data->InCallback = true;

  cmListFileFunction newLFF;
  cmListFileArgument arg;
  bool processed = false;
  const char* accessString = cmVariableWatch::GetAccessAsString(access_type);
  const char* currentListFile = mf->GetDefinition("CMAKE_CURRENT_LIST_FILE");

  /// Ultra bad!!
  cmMakefile* makefile = const_cast<cmMakefile*>(mf);

  std::string stack = makefile->GetProperty("LISTFILE_STACK");
  if ( !data->Command.empty() )
    {
    newLFF.Arguments.clear();
    newLFF.Arguments.push_back(
      cmListFileArgument(variable, cmListFileArgument::Quoted,
                         9999));
    newLFF.Arguments.push_back(
      cmListFileArgument(accessString, cmListFileArgument::Quoted,
                         9999));
    newLFF.Arguments.push_back(
      cmListFileArgument(newValue?newValue:"", cmListFileArgument::Quoted,
                         9999));
    newLFF.Arguments.push_back(
      cmListFileArgument(currentListFile, cmListFileArgument::Quoted,
                         9999));
    newLFF.Arguments.push_back(
      cmListFileArgument(stack, cmListFileArgument::Quoted,
                         9999));
    newLFF.Name = data->Command;
    newLFF.FilePath = "unknown";
    newLFF.Line = 9999;
    cmExecutionStatus status;
    if(!makefile->ExecuteCommand(newLFF,status))
      {
      std::ostringstream error;
      error << "Error in cmake code at\nUnknown:0:\n"
        << "A command failed during the invocation of callback \""
        << data->Command << "\".";
      cmSystemTools::Error(error.str().c_str());
      data->InCallback = false;
      return;
      }
    processed = true;
    }
  if ( !processed )
    {
    std::ostringstream msg;
    msg << "Variable \"" << variable << "\" was accessed using "
        << accessString << " with value \"" << (newValue?newValue:"") << "\".";
    makefile->IssueMessage(cmake::LOG, msg.str());
    }

  data->InCallback = false;
}